

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O0

int funchook_page_unprotect(funchook_t *funchook,funchook_page_t *page)

{
  int iVar1;
  char *pcVar2;
  void *in_RSI;
  funchook_t *in_RDI;
  int rv;
  char errbuf [128];
  char *in_stack_ffffffffffffff48;
  int local_4;
  
  iVar1 = mprotect(in_RSI,0x1000,3);
  if (iVar1 == 0) {
    funchook_log(in_RDI,"  unprotect page %p (size=%lu)\n",in_RSI,0x1000);
    local_4 = 0;
  }
  else {
    __errno_location();
    pcVar2 = funchook_strerror((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff48,0x1031a9);
    funchook_set_error_message
              (in_RDI,"Failed to unprotect page %p (size=%lu, error=%s)",in_RSI,0x1000,pcVar2);
    local_4 = 9;
  }
  return local_4;
}

Assistant:

int funchook_page_unprotect(funchook_t *funchook, funchook_page_t *page)
{
    char errbuf[128];
    int rv = mprotect(page, page_size, PROT_READ | PROT_WRITE);

    if (rv == 0) {
        funchook_log(funchook, "  unprotect page %p (size=%"PRIuPTR")\n",
                     page, page_size);
        return 0;
    }
    funchook_set_error_message(funchook, "Failed to unprotect page %p (size=%"PRIuPTR", error=%s)",
                               page, page_size,
                               funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_FUNCTION;
}